

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misc_tests.c
# Opt level: O0

void cjson_should_not_follow_too_deep_circular_references(void)

{
  cJSON *array;
  cJSON *pcVar1;
  cJSON *item;
  cJSON *x;
  cJSON *b;
  cJSON *a;
  cJSON *o;
  
  array = cJSON_CreateArray();
  pcVar1 = cJSON_CreateArray();
  item = cJSON_CreateArray();
  cJSON_AddItemToArray(array,pcVar1);
  cJSON_AddItemToArray(pcVar1,item);
  cJSON_AddItemToArray(item,array);
  pcVar1 = cJSON_Duplicate(array,1);
  if (pcVar1 != (cJSON *)0x0) {
    UnityFail(" Expected NULL",0xea);
  }
  cJSON_DetachItemFromArray(item,0);
  cJSON_Delete(array);
  return;
}

Assistant:

static void cjson_should_not_follow_too_deep_circular_references(void)
{
    cJSON *o = cJSON_CreateArray();
    cJSON *a = cJSON_CreateArray();
    cJSON *b = cJSON_CreateArray();
    cJSON *x;

    cJSON_AddItemToArray(o, a);
    cJSON_AddItemToArray(a, b);
    cJSON_AddItemToArray(b, o);

    x = cJSON_Duplicate(o, 1);
    TEST_ASSERT_NULL(x);
    cJSON_DetachItemFromArray(b, 0);
    cJSON_Delete(o);
}